

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O1

void __thiscall
HttpdBufferedReader_Span_Test::~HttpdBufferedReader_Span_Test(HttpdBufferedReader_Span_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (HttpdBufferedReader, Span) {
    using byte_span = pstore::gsl::span<std::uint8_t>;
    auto refill = [] (int io, byte_span const & sp) {
        std::fill (std::begin (sp), std::end (sp), std::uint8_t{0});
        return pstore::error_or_n<int, byte_span::iterator>{pstore::in_place, io, sp.end ()};
    };

    constexpr auto buffer_size = std::size_t{0};
    constexpr auto requested_size = std::size_t{1};
    auto br = pstore::http::make_buffered_reader<int> (refill, buffer_size);

    std::vector<std::uint8_t> v (requested_size, std::uint8_t{0xFF});
    pstore::error_or_n<int, byte_span> res = br.get_span (0, pstore::gsl::make_span (v));
    ASSERT_TRUE (res);
    auto const & sp = pstore::get<1> (res);
    ASSERT_EQ (sp.size (), 1);
    EXPECT_EQ (sp[0], std::uint8_t{0});
}